

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_add_input_at(wally_tx *tx,uint32_t index,wally_tx_input *input)

{
  wally_tx_witness_stack *pwVar1;
  _Bool _Var2;
  wally_tx_input *pwVar3;
  size_t sVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  wally_tx_witness_stack *new_pegin_witness;
  uchar *local_70;
  uchar *local_68;
  uchar *local_60;
  uchar *local_58;
  uchar *local_50;
  wally_tx_witness_stack *local_48;
  wally_tx_witness_stack *local_40;
  long local_38;
  
  _Var2 = is_valid_tx(tx);
  if (!_Var2) {
    return -2;
  }
  uVar7 = (ulong)index;
  uVar6 = tx->num_inputs;
  if (uVar6 < uVar7) {
    return -2;
  }
  _Var2 = is_valid_tx_input(input);
  if (!_Var2) {
    return -2;
  }
  pwVar3 = tx->inputs;
  if (tx->inputs_allocation_len <= uVar6) {
    pwVar3 = (wally_tx_input *)realloc_array(pwVar3,tx->inputs_allocation_len,uVar6 + 1,0xd0);
    if (pwVar3 == (wally_tx_input *)0x0) {
      return -3;
    }
    clear_and_free(tx->inputs,tx->num_inputs * 0xd0);
    tx->inputs = pwVar3;
    tx->inputs_allocation_len = tx->inputs_allocation_len + 1;
    uVar6 = tx->num_inputs;
  }
  memmove(pwVar3 + uVar7 + 1,pwVar3 + uVar7,(uVar6 - uVar7) * 0xd0);
  pwVar3 = tx->inputs + uVar7;
  local_40 = (wally_tx_witness_stack *)0x0;
  local_48 = (wally_tx_witness_stack *)0x0;
  local_38 = uVar7 * 0xd0;
  if (input->witness != (wally_tx_witness_stack *)0x0) {
    wally_tx_witness_stack_clone_alloc(input->witness,&local_48);
  }
  if (input->pegin_witness != (wally_tx_witness_stack *)0x0) {
    wally_tx_witness_stack_clone_alloc(input->pegin_witness,&local_40);
  }
  sVar4 = input->script_len;
  if (sVar4 == 0) {
    local_68 = (uchar *)0x0;
  }
  else {
    puVar5 = input->script;
    local_68 = (uchar *)wally_malloc(sVar4);
    if (local_68 == (uchar *)0x0) {
      local_68 = (uchar *)0x0;
      local_60 = (uchar *)0x0;
      local_58 = (uchar *)0x0;
      local_50 = (uchar *)0x0;
      local_70 = (uchar *)0x0;
      goto LAB_004f6c80;
    }
    memcpy(local_68,puVar5,sVar4);
  }
  sVar4 = input->issuance_amount_len;
  if (sVar4 == 0) {
    local_60 = (uchar *)0x0;
  }
  else {
    puVar5 = input->issuance_amount;
    local_60 = (uchar *)wally_malloc(sVar4);
    if (local_60 == (uchar *)0x0) {
      local_60 = (uchar *)0x0;
      local_58 = (uchar *)0x0;
      local_50 = (uchar *)0x0;
      local_70 = (uchar *)0x0;
      goto LAB_004f6c80;
    }
    memcpy(local_60,puVar5,sVar4);
  }
  sVar4 = input->inflation_keys_len;
  if (sVar4 == 0) {
    local_58 = (uchar *)0x0;
  }
  else {
    puVar5 = input->inflation_keys;
    local_58 = (uchar *)wally_malloc(sVar4);
    if (local_58 == (uchar *)0x0) {
      local_58 = (uchar *)0x0;
      local_50 = (uchar *)0x0;
      local_70 = (uchar *)0x0;
      goto LAB_004f6c80;
    }
    memcpy(local_58,puVar5,sVar4);
  }
  sVar4 = input->issuance_amount_rangeproof_len;
  if (sVar4 == 0) {
    local_50 = (uchar *)0x0;
  }
  else {
    puVar5 = input->issuance_amount_rangeproof;
    local_50 = (uchar *)wally_malloc(sVar4);
    if (local_50 == (uchar *)0x0) {
      local_50 = (uchar *)0x0;
      local_70 = (uchar *)0x0;
      goto LAB_004f6c80;
    }
    memcpy(local_50,puVar5,sVar4);
  }
  sVar4 = input->inflation_keys_rangeproof_len;
  if (sVar4 == 0) {
    local_70 = (uchar *)0x0;
  }
  else {
    puVar5 = input->inflation_keys_rangeproof;
    local_70 = (uchar *)wally_malloc(sVar4);
    if (local_70 == (uchar *)0x0) {
      local_70 = (uchar *)0x0;
      goto LAB_004f6c80;
    }
    memcpy(local_70,puVar5,sVar4);
  }
  pwVar1 = local_48;
  if (local_48 != (wally_tx_witness_stack *)0x0 || input->witness == (wally_tx_witness_stack *)0x0)
  {
    memcpy(pwVar3,input,200);
    pwVar3->script = local_68;
    pwVar3->issuance_amount = local_60;
    pwVar3->inflation_keys = local_58;
    pwVar3->issuance_amount_rangeproof = local_50;
    pwVar3->inflation_keys_rangeproof = local_70;
    pwVar3->pegin_witness = local_40;
    pwVar3->witness = pwVar1;
    tx->num_inputs = tx->num_inputs + 1;
    return 0;
  }
LAB_004f6c80:
  clear_and_free(local_68,input->script_len);
  clear_and_free(local_60,input->issuance_amount_len);
  clear_and_free(local_58,input->inflation_keys_len);
  clear_and_free(local_50,input->issuance_amount_rangeproof_len);
  sVar4 = input->inflation_keys_rangeproof_len;
  clear_and_free(local_70,sVar4);
  _Var2 = SUB81(sVar4,0);
  tx_witness_stack_free(local_40,_Var2);
  tx_witness_stack_free(local_48,_Var2);
  puVar5 = tx->inputs->txhash + local_38;
  memmove(puVar5,puVar5 + 0xd0,(tx->num_inputs - uVar7) * 0xd0);
  return -3;
}

Assistant:

int wally_tx_add_input_at(struct wally_tx *tx, uint32_t index,
                          const struct wally_tx_input *input)
{
    if (!is_valid_tx(tx) || index > tx->num_inputs || !is_valid_tx_input(input))
        return WALLY_EINVAL;

    if (tx->num_inputs >= tx->inputs_allocation_len) {
        /* Expand the inputs array */
        struct wally_tx_input *p;
        p = realloc_array(tx->inputs, tx->inputs_allocation_len,
                          tx->num_inputs + 1, sizeof(*tx->inputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->inputs, tx->num_inputs * sizeof(*tx->inputs));
        tx->inputs = p;
        tx->inputs_allocation_len += 1;
    }

    memmove(tx->inputs + index + 1, tx->inputs + index,
            (tx->num_inputs - index) * sizeof(*input));

    if (!clone_input_to(tx->inputs + index, input)) {
        memmove(tx->inputs + index, tx->inputs + index + 1,
                (tx->num_inputs - index) * sizeof(*input)); /* Undo */
        return WALLY_ENOMEM;
    }

    tx->num_inputs += 1;
    return WALLY_OK;
}